

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O3

void __thiscall
qpdf::Array::setFromVector
          (Array *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *v)

{
  pointer pQVar1;
  element_type *peVar2;
  element_type *peVar3;
  QPDF *pQVar4;
  QPDF *pQVar5;
  QPDF_Array *pQVar6;
  logic_error *this_00;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this_01;
  pointer __args;
  
  pQVar6 = array(this);
  this_01 = &pQVar6->elements;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::resize(this_01,0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
            (this_01,(long)(v->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(v->
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 4);
  __args = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pQVar1 = (v->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (__args == pQVar1) {
      return;
    }
    peVar2 = (__args->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) break;
    peVar3 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (((peVar3 != (element_type *)0x0) && (pQVar4 = peVar3->qpdf, pQVar4 != (QPDF *)0x0)) &&
       (pQVar5 = peVar2->qpdf, pQVar4 != pQVar5 && pQVar5 != (QPDF *)0x0)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,
                 "Attempting to add an object from a different QPDF. Use QPDF::copyForeignObject to add objects from another file."
                );
      goto LAB_001f9471;
    }
    std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
    emplace_back<QPDFObjectHandle_const&>
              ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)this_01,__args);
    __args = __args + 1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,"Attempting to add an uninitialized object to a QPDF_Array.");
LAB_001f9471:
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Array::setFromVector(std::vector<QPDFObjectHandle> const& v)
{
    auto a = array();
    a->elements.resize(0);
    a->elements.reserve(v.size());
    for (auto const& item: v) {
        checkOwnership(item);
        a->elements.emplace_back(item);
    }
}